

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_poly_line
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_draw_list_stroke closed,float thickness,nk_anti_aliasing aliasing)

{
  float fVar1;
  void *pvVar2;
  bool bVar3;
  short sVar4;
  short sVar5;
  nk_draw_index nVar6;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_colorf color_03;
  nk_colorf color_04;
  nk_colorf color_05;
  nk_colorf color_06;
  nk_colorf color_07;
  nk_colorf color_08;
  nk_colorf color_09;
  nk_colorf color_10;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  nk_size count_00;
  void *pvVar11;
  float *pfVar12;
  nk_vec2 *pnVar13;
  float fVar14;
  nk_vec2 nVar15;
  nk_vec2 nVar16;
  long local_498;
  float local_44c;
  ulong local_440;
  long local_438;
  float local_3a4;
  ulong local_398;
  long local_390;
  long local_338;
  uint local_32c;
  float local_2f4;
  float fStack_2f0;
  float len_1;
  nk_vec2 diff_1;
  nk_vec2 p2;
  nk_vec2 p1;
  nk_size i2_3;
  nk_vec2 uv_2;
  float dy;
  float dx;
  nk_draw_index *ids_1;
  void *vtx_1;
  nk_size vtx_count_1;
  nk_size idx_count_1;
  nk_size idx;
  nk_size i1_1;
  nk_vec2 uv_1;
  float scale_1;
  float dmr2_1;
  float local_240;
  nk_vec2 local_238;
  nk_vec2 dm_1;
  nk_size idx2_1;
  nk_size i2_2;
  nk_vec2 dm_in;
  nk_vec2 dm_out;
  float local_1c0;
  float fStack_1bc;
  nk_vec2 d2;
  nk_vec2 d1;
  ulong uStack_1a8;
  float half_inner_thickness;
  nk_size i_1;
  nk_size idx1_1;
  nk_vec2 uv;
  float scale;
  float local_160;
  nk_size idx2;
  nk_size i2_1;
  float fStack_138;
  float dmr2;
  nk_vec2 dm;
  float fStack_114;
  float local_110;
  float fStack_fc;
  float local_f8;
  float local_e8;
  float fStack_e4;
  nk_vec2 d;
  nk_size i;
  nk_size idx1;
  float local_c4;
  float fStack_c0;
  float len;
  nk_vec2 diff;
  nk_size i2;
  nk_vec2 *temp;
  nk_vec2 *normals;
  nk_size size;
  nk_draw_index *ids;
  void *vtx;
  nk_size vtx_count;
  nk_size idx_count;
  nk_size index;
  nk_size vertex_offset;
  nk_size i1;
  float AA_SIZE;
  nk_colorf col_trans;
  nk_colorf col;
  int thick_line;
  nk_size count;
  nk_anti_aliasing aliasing_local;
  float thickness_local;
  nk_draw_list_stroke closed_local;
  uint points_count_local;
  nk_vec2 *points_local;
  nk_draw_list *list_local;
  nk_color color_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1ffe,
                  "void nk_draw_list_stroke_poly_line(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_draw_list_stroke, float, enum nk_anti_aliasing)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && (1 < points_count)) {
    register0x00000000 = (ulong)points_count;
    if (closed == NK_STROKE_OPEN) {
      register0x00000000 = (ulong)(points_count - 1);
    }
    bVar3 = 1.0 < thickness;
    list_local._4_4_ =
         (nk_color)
         CONCAT13((nk_byte)(int)((float)((int)((float)((uint)color >> 0x18) *
                                              (list->config).global_alpha) & 0xff) *
                                (list->config).global_alpha),color._0_3_);
    nk_color_fv(&col_trans.b,list_local._4_4_);
    uVar7 = col_trans._8_8_;
    col_trans.r = col.r;
    col_trans.g = 0.0;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      uVar10 = (ulong)list->vertex_count;
      if (bVar3) {
        count_00 = stack0xffffffffffffffc8 * 0x12;
        local_32c = points_count << 2;
      }
      else {
        count_00 = stack0xffffffffffffffc8 * 0xc;
        local_32c = points_count * 3;
      }
      pvVar11 = nk_draw_list_alloc_vertices(list,(ulong)local_32c);
      size = (nk_size)nk_draw_list_alloc_elements(list,count_00);
      if ((pvVar11 != (void *)0x0) && ((nk_draw_index *)size != (nk_draw_index *)0x0)) {
        pvVar2 = (list->vertices->memory).ptr;
        nk_buffer_mark(list->vertices,NK_BUFFER_FRONT);
        iVar9 = 3;
        if (bVar3) {
          iVar9 = 5;
        }
        pfVar12 = (float *)nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,
                                           (long)iVar9 * 8 * (ulong)points_count,4);
        if (pfVar12 == (float *)0x0) {
          __assert_fail("normals",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x2029,
                        "void nk_draw_list_stroke_poly_line(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_draw_list_stroke, float, enum nk_anti_aliasing)"
                       );
        }
        if (pfVar12 != (float *)0x0) {
          pnVar13 = (nk_vec2 *)(pfVar12 + (ulong)points_count * 2);
          ids = (nk_draw_index *)
                ((long)pvVar11 + ((long)(list->vertices->memory).ptr - (long)pvVar2));
          for (vertex_offset = 0; vertex_offset < stack0xffffffffffffffc8;
              vertex_offset = vertex_offset + 1) {
            if (vertex_offset + 1 == (ulong)points_count) {
              local_338 = 0;
            }
            else {
              local_338 = vertex_offset + 1;
            }
            nVar15 = nk_vec2(points[local_338].x - points[vertex_offset].x,
                             points[local_338].y - points[vertex_offset].y);
            fStack_c0 = nVar15.x;
            len = nVar15.y;
            fVar14 = fStack_c0 * fStack_c0 + len * len;
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              local_c4 = nk_inv_sqrt(fVar14);
            }
            else {
              local_c4 = 1.0;
            }
            nVar15 = nk_vec2(fStack_c0 * local_c4,len * local_c4);
            len = nVar15.y;
            pfVar12[vertex_offset * 2] = len;
            fStack_c0 = nVar15.x;
            pfVar12[vertex_offset * 2 + 1] = -fStack_c0;
          }
          if (closed == NK_STROKE_OPEN) {
            *(undefined8 *)(pfVar12 + (ulong)(points_count - 1) * 2) =
                 *(undefined8 *)(pfVar12 + (ulong)(points_count - 2) * 2);
          }
          if (bVar3) {
            fVar14 = (thickness - 1.0) * 0.5;
            if (closed == NK_STROKE_OPEN) {
              nVar15 = nk_vec2(*pfVar12 * (fVar14 + 1.0),pfVar12[1] * (fVar14 + 1.0));
              nVar16 = nk_vec2(*pfVar12 * fVar14,pfVar12[1] * fVar14);
              d2.x = nVar15.x;
              d2.y = nVar15.y;
              nVar15 = nk_vec2(points->x + d2.x,points->y + d2.y);
              *pnVar13 = nVar15;
              local_1c0 = nVar16.x;
              fStack_1bc = nVar16.y;
              nVar15 = nk_vec2(points->x + local_1c0,points->y + fStack_1bc);
              pnVar13[1] = nVar15;
              nVar15 = nk_vec2(points->x - local_1c0,points->y - fStack_1bc);
              pnVar13[2] = nVar15;
              nVar15 = nk_vec2(points->x - d2.x,points->y - d2.y);
              pnVar13[3] = nVar15;
              nVar15 = nk_vec2(pfVar12[(ulong)(points_count - 1) * 2] * (fVar14 + 1.0),
                               pfVar12[(ulong)(points_count - 1) * 2 + 1] * (fVar14 + 1.0));
              nVar16 = nk_vec2(pfVar12[(ulong)(points_count - 1) * 2] * fVar14,
                               pfVar12[(ulong)(points_count - 1) * 2 + 1] * fVar14);
              d2.x = nVar15.x;
              d2.y = nVar15.y;
              nVar15 = nk_vec2(points[points_count - 1].x + d2.x,points[points_count - 1].y + d2.y);
              pnVar13[points_count * 4 - 4] = nVar15;
              local_1c0 = nVar16.x;
              fStack_1bc = nVar16.y;
              nVar15 = nk_vec2(points[points_count - 1].x + local_1c0,
                               points[points_count - 1].y + fStack_1bc);
              pnVar13[(ulong)(points_count * 4 - 4) + 1] = nVar15;
              nVar15 = nk_vec2(points[points_count - 1].x - local_1c0,
                               points[points_count - 1].y - fStack_1bc);
              pnVar13[(ulong)(points_count * 4 - 4) + 2] = nVar15;
              nVar15 = nk_vec2(points[points_count - 1].x - d2.x,points[points_count - 1].y - d2.y);
              pnVar13[points_count * 4 - 1] = nVar15;
            }
            i_1 = uVar10;
            for (vertex_offset = 0; vertex_offset < stack0xffffffffffffffc8;
                vertex_offset = vertex_offset + 1) {
              if (vertex_offset + 1 == (ulong)points_count) {
                local_438 = 0;
              }
              else {
                local_438 = vertex_offset + 1;
              }
              local_440 = uVar10;
              if (vertex_offset + 1 != (ulong)points_count) {
                local_440 = i_1 + 4;
              }
              nVar15 = nk_vec2(pfVar12[vertex_offset * 2] + pfVar12[local_438 * 2],
                               pfVar12[vertex_offset * 2 + 1] + pfVar12[local_438 * 2 + 1]);
              local_240 = nVar15.x;
              nVar15 = nk_vec2(pfVar12[vertex_offset * 2] + pfVar12[local_438 * 2],
                               pfVar12[vertex_offset * 2 + 1] + pfVar12[local_438 * 2 + 1]);
              dmr2_1 = nVar15.y;
              local_238 = nk_vec2(local_240 * 0.5,dmr2_1 * 0.5);
              local_44c = local_238.x * local_238.x + local_238.y * local_238.y;
              if (1e-06 < local_44c) {
                local_44c = 1.0 / local_44c;
                if (100.0 < local_44c) {
                  local_44c = 100.0;
                }
                local_238 = nk_vec2(local_238.x * local_44c,local_238.y * local_44c);
              }
              nVar15 = nk_vec2(local_238.x * (fVar14 + 1.0),local_238.y * (fVar14 + 1.0));
              nVar16 = nk_vec2(local_238.x * fVar14,local_238.y * fVar14);
              dm_in.x = nVar15.x;
              dm_in.y = nVar15.y;
              nVar15 = nk_vec2(points[local_438].x + dm_in.x,points[local_438].y + dm_in.y);
              pnVar13[local_438 * 4] = nVar15;
              i2_2._0_4_ = nVar16.x;
              i2_2._4_4_ = nVar16.y;
              nVar15 = nk_vec2(points[local_438].x + (float)i2_2,points[local_438].y + i2_2._4_4_);
              pnVar13[local_438 * 4 + 1] = nVar15;
              nVar15 = nk_vec2(points[local_438].x - (float)i2_2,points[local_438].y - i2_2._4_4_);
              pnVar13[local_438 * 4 + 2] = nVar15;
              nVar15 = nk_vec2(points[local_438].x - dm_in.x,points[local_438].y - dm_in.y);
              pnVar13[local_438 * 4 + 3] = nVar15;
              sVar4 = (short)local_440;
              *(short *)size = sVar4 + 1;
              sVar5 = (short)i_1;
              *(short *)(size + 2) = sVar5 + 1;
              *(short *)(size + 4) = sVar5 + 2;
              *(short *)(size + 6) = sVar5 + 2;
              *(short *)(size + 8) = sVar4 + 2;
              *(short *)(size + 10) = sVar4 + 1;
              *(short *)(size + 0xc) = sVar4 + 1;
              *(short *)(size + 0xe) = sVar5 + 1;
              *(short *)(size + 0x10) = sVar5;
              *(short *)(size + 0x12) = sVar5;
              *(short *)(size + 0x14) = sVar4;
              *(short *)(size + 0x16) = sVar4 + 1;
              *(short *)(size + 0x18) = sVar4 + 2;
              *(short *)(size + 0x1a) = sVar5 + 2;
              *(short *)(size + 0x1c) = sVar5 + 3;
              *(short *)(size + 0x1e) = sVar5 + 3;
              *(short *)(size + 0x20) = sVar4 + 3;
              *(short *)(size + 0x22) = sVar4 + 2;
              size = size + 0x24;
              i_1 = local_440;
            }
            for (uStack_1a8 = 0; uVar8 = col_trans._8_8_, uStack_1a8 < points_count;
                uStack_1a8 = uStack_1a8 + 1) {
              nVar15 = (list->config).null.uv;
              color_02.b = col_trans.r;
              col_trans.b = (float)uVar7;
              col_trans.a = SUB84(uVar7,4);
              color_02.r = col_trans.b;
              color_02.g = col_trans.a;
              color_02.a = col_trans.g;
              col_trans._8_8_ = uVar8;
              pvVar11 = nk_draw_vertex(ids,&list->config,pnVar13[uStack_1a8 * 4],nVar15,color_02);
              color_05._8_8_ = col._0_8_;
              color_05.r = col_trans.b;
              color_05.g = col_trans.a;
              pvVar11 = nk_draw_vertex(pvVar11,&list->config,pnVar13[uStack_1a8 * 4 + 1],nVar15,
                                       color_05);
              color_06._8_8_ = col._0_8_;
              color_06.r = col_trans.b;
              color_06.g = col_trans.a;
              pvVar11 = nk_draw_vertex(pvVar11,&list->config,pnVar13[uStack_1a8 * 4 + 2],nVar15,
                                       color_06);
              uVar8 = col_trans._8_8_;
              color_03.b = col_trans.r;
              col_trans.b = (float)uVar7;
              col_trans.a = SUB84(uVar7,4);
              color_03.r = col_trans.b;
              color_03.g = col_trans.a;
              color_03.a = col_trans.g;
              col_trans._8_8_ = uVar8;
              ids = (nk_draw_index *)
                    nk_draw_vertex(pvVar11,&list->config,pnVar13[uStack_1a8 * 4 + 3],nVar15,color_03
                                  );
            }
          }
          else {
            if (closed == NK_STROKE_OPEN) {
              fVar14 = points->x;
              nVar15 = nk_vec2(*pfVar12,pfVar12[1]);
              local_f8 = nVar15.x;
              fVar1 = points->y;
              nVar15 = nk_vec2(*pfVar12,pfVar12[1]);
              fStack_fc = nVar15.y;
              nVar15 = nk_vec2(fVar14 + local_f8,fVar1 + fStack_fc);
              *pnVar13 = nVar15;
              fVar14 = points->x;
              nVar15 = nk_vec2(*pfVar12,pfVar12[1]);
              local_110 = nVar15.x;
              fVar1 = points->y;
              nVar15 = nk_vec2(*pfVar12,pfVar12[1]);
              fStack_114 = nVar15.y;
              nVar15 = nk_vec2(fVar14 - local_110,fVar1 - fStack_114);
              pnVar13[1] = nVar15;
              nVar15 = nk_vec2(pfVar12[(ulong)(points_count - 1) * 2],
                               pfVar12[(ulong)(points_count - 1) * 2 + 1]);
              local_e8 = nVar15.x;
              fStack_e4 = nVar15.y;
              nVar15 = nk_vec2(points[points_count - 1].x + local_e8,
                               points[points_count - 1].y + fStack_e4);
              pnVar13[points_count * 2 - 2] = nVar15;
              nVar15 = nk_vec2(points[points_count - 1].x - local_e8,
                               points[points_count - 1].y - fStack_e4);
              pnVar13[points_count * 2 - 1] = nVar15;
            }
            i = uVar10;
            for (vertex_offset = 0; vertex_offset < stack0xffffffffffffffc8;
                vertex_offset = vertex_offset + 1) {
              if (vertex_offset + 1 == (ulong)points_count) {
                local_390 = 0;
              }
              else {
                local_390 = vertex_offset + 1;
              }
              local_398 = uVar10;
              if (vertex_offset + 1 != (ulong)points_count) {
                local_398 = i + 3;
              }
              nVar15 = nk_vec2(pfVar12[vertex_offset * 2] + pfVar12[local_390 * 2],
                               pfVar12[vertex_offset * 2 + 1] + pfVar12[local_390 * 2 + 1]);
              local_160 = nVar15.x;
              nVar15 = nk_vec2(pfVar12[vertex_offset * 2] + pfVar12[local_390 * 2],
                               pfVar12[vertex_offset * 2 + 1] + pfVar12[local_390 * 2 + 1]);
              scale = nVar15.y;
              _fStack_138 = nk_vec2(local_160 * 0.5,scale * 0.5);
              local_3a4 = fStack_138 * fStack_138 + dmr2 * dmr2;
              if (1e-06 < local_3a4) {
                local_3a4 = 1.0 / local_3a4;
                if (100.0 < local_3a4) {
                  local_3a4 = 100.0;
                }
                _fStack_138 = nk_vec2(fStack_138 * local_3a4,dmr2 * local_3a4);
              }
              nVar15 = nk_vec2(fStack_138,dmr2);
              fStack_138 = nVar15.x;
              dmr2 = nVar15.y;
              nVar15 = nk_vec2(points[local_390].x + fStack_138,points[local_390].y + dmr2);
              pnVar13[local_390 * 2] = nVar15;
              nVar15 = nk_vec2(points[local_390].x - fStack_138,points[local_390].y - dmr2);
              pnVar13[local_390 * 2 + 1] = nVar15;
              sVar4 = (short)local_398;
              *(short *)size = sVar4;
              sVar5 = (short)i;
              *(short *)(size + 2) = sVar5;
              *(short *)(size + 4) = sVar5 + 2;
              *(short *)(size + 6) = sVar5 + 2;
              *(short *)(size + 8) = sVar4 + 2;
              *(short *)(size + 10) = sVar4;
              *(short *)(size + 0xc) = sVar4 + 1;
              *(short *)(size + 0xe) = sVar5 + 1;
              *(short *)(size + 0x10) = sVar5;
              *(short *)(size + 0x12) = sVar5;
              *(short *)(size + 0x14) = sVar4;
              *(short *)(size + 0x16) = sVar4 + 1;
              size = size + 0x18;
              i = local_398;
            }
            d.x = 0.0;
            d.y = 0.0;
            for (; nVar15.y = 0.0, nVar15.x = (float)points_count, (ulong)d < (ulong)nVar15;
                d = (nk_vec2)((long)d + 1)) {
              nVar15 = (list->config).null.uv;
              color_04._8_8_ = col._0_8_;
              color_04.r = col_trans.b;
              color_04.g = col_trans.a;
              pvVar11 = nk_draw_vertex(ids,&list->config,points[(long)d],nVar15,color_04);
              uVar8 = col_trans._8_8_;
              color_00.b = col_trans.r;
              col_trans.b = (float)uVar7;
              col_trans.a = SUB84(uVar7,4);
              color_00.r = col_trans.b;
              color_00.g = col_trans.a;
              color_00.a = col_trans.g;
              col_trans._8_8_ = uVar8;
              pvVar11 = nk_draw_vertex(pvVar11,&list->config,pnVar13[(long)d * 2],nVar15,color_00);
              uVar8 = col_trans._8_8_;
              color_01.b = col_trans.r;
              col_trans.b = (float)uVar7;
              col_trans.a = SUB84(uVar7,4);
              color_01.r = col_trans.b;
              color_01.g = col_trans.a;
              color_01.a = col_trans.g;
              col_trans._8_8_ = uVar8;
              ids = (nk_draw_index *)
                    nk_draw_vertex(pvVar11,&list->config,pnVar13[(long)d * 2 + 1],nVar15,color_01);
            }
          }
          nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
        }
      }
    }
    else {
      idx_count_1 = (nk_size)list->vertex_count;
      ids_1 = (nk_draw_index *)nk_draw_list_alloc_vertices(list,stack0xffffffffffffffc8 << 2);
      _dy = nk_draw_list_alloc_elements(list,stack0xffffffffffffffc8 * 6);
      if ((ids_1 != (nk_draw_index *)0x0) && (_dy != (nk_draw_index *)0x0)) {
        for (idx = 0; idx < stack0xffffffffffffffc8; idx = idx + 1) {
          nVar15 = (list->config).null.uv;
          if (idx + 1 == (ulong)points_count) {
            local_498 = 0;
          }
          else {
            local_498 = idx + 1;
          }
          diff_1.x = points[local_498].x;
          diff_1.y = points[local_498].y;
          p2.x = points[idx].x;
          p2.y = points[idx].y;
          nVar16 = nk_vec2(diff_1.x - p2.x,diff_1.y - p2.y);
          fStack_2f0 = nVar16.x;
          len_1 = nVar16.y;
          fVar14 = fStack_2f0 * fStack_2f0 + len_1 * len_1;
          if ((fVar14 != 0.0) || (NAN(fVar14))) {
            local_2f4 = nk_inv_sqrt(fVar14);
          }
          else {
            local_2f4 = 1.0;
          }
          nVar16 = nk_vec2(fStack_2f0 * local_2f4,len_1 * local_2f4);
          fStack_2f0 = nVar16.x;
          fStack_2f0 = fStack_2f0 * thickness * 0.5;
          len_1 = nVar16.y;
          fVar14 = len_1 * thickness * 0.5;
          nVar16 = nk_vec2(p2.x + fVar14,p2.y - fStack_2f0);
          color_07._8_8_ = col._0_8_;
          color_07.r = col_trans.b;
          color_07.g = col_trans.a;
          pvVar11 = nk_draw_vertex(ids_1,&list->config,nVar16,nVar15,color_07);
          nVar16 = nk_vec2(diff_1.x + fVar14,diff_1.y - fStack_2f0);
          color_08._8_8_ = col._0_8_;
          color_08.r = col_trans.b;
          color_08.g = col_trans.a;
          pvVar11 = nk_draw_vertex(pvVar11,&list->config,nVar16,nVar15,color_08);
          nVar16 = nk_vec2(diff_1.x - fVar14,diff_1.y + fStack_2f0);
          color_09._8_8_ = col._0_8_;
          color_09.r = col_trans.b;
          color_09.g = col_trans.a;
          pvVar11 = nk_draw_vertex(pvVar11,&list->config,nVar16,nVar15,color_09);
          nVar16 = nk_vec2(p2.x - fVar14,p2.y + fStack_2f0);
          color_10._8_8_ = col._0_8_;
          color_10.r = col_trans.b;
          color_10.g = col_trans.a;
          ids_1 = (nk_draw_index *)nk_draw_vertex(pvVar11,&list->config,nVar16,nVar15,color_10);
          nVar6 = (nk_draw_index)idx_count_1;
          *_dy = nVar6;
          _dy[1] = nVar6 + 1;
          _dy[2] = nVar6 + 2;
          _dy[3] = nVar6;
          _dy[4] = nVar6 + 2;
          _dy[5] = nVar6 + 3;
          _dy = _dy + 6;
          idx_count_1 = idx_count_1 + 4;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_poly_line(struct nk_draw_list *list, const struct nk_vec2 *points,
    const unsigned int points_count, struct nk_color color, enum nk_draw_list_stroke closed,
    float thickness, enum nk_anti_aliasing aliasing)
{
    nk_size count;
    int thick_line;
    struct nk_colorf col;
    struct nk_colorf col_trans;
    NK_ASSERT(list);
    if (!list || points_count < 2) return;

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    count = points_count;
    if (!closed) count = points_count-1;
    thick_line = thickness > 1.0f;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        /* ANTI-ALIASED STROKE */
        const float AA_SIZE = 1.0f;
        NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
        NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);

        /* allocate vertices and elements  */
        nk_size i1 = 0;
        nk_size vertex_offset;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (thick_line) ?  (count * 18) : (count * 12);
        const nk_size vtx_count = (thick_line) ? (points_count * 4): (points_count *3);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size;
        struct nk_vec2 *normals, *temp;
        if (!vtx || !ids) return;

        /* temporary allocate normals + points */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * ((thick_line) ? 5 : 3) * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        NK_ASSERT(normals);
        if (!normals) return;
        temp = normals + points_count;

        /* make sure vertex pointer is still correct */
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* calculate normals */
        for (i1 = 0; i1 < count; ++i1) {
            const nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
            struct nk_vec2 diff = nk_vec2_sub(points[i2], points[i1]);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;

            diff = nk_vec2_muls(diff, len);
            normals[i1].x = diff.y;
            normals[i1].y = -diff.x;
        }

        if (!closed)
            normals[points_count-1] = normals[points_count-2];

        if (!thick_line) {
            nk_size idx1, i;
            if (!closed) {
                struct nk_vec2 d;
                temp[0] = nk_vec2_add(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                temp[1] = nk_vec2_sub(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                d = nk_vec2_muls(normals[points_count-1], AA_SIZE);
                temp[(points_count-1) * 2 + 0] = nk_vec2_add(points[points_count-1], d);
                temp[(points_count-1) * 2 + 1] = nk_vec2_sub(points[points_count-1], d);
            }

            /* fill elements */
            idx1 = index;
            for (i1 = 0; i1 < count; i1++) {
                struct nk_vec2 dm;
                float dmr2;
                nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 3);

                /* average normals */
                dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm = nk_vec2_muls(dm, AA_SIZE);
                temp[i2*2+0] = nk_vec2_add(points[i2], dm);
                temp[i2*2+1] = nk_vec2_sub(points[i2], dm);

                ids[0] = (nk_draw_index)(idx2 + 0); ids[1] = (nk_draw_index)(idx1+0);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+0);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11]= (nk_draw_index)(idx2+1);
                ids += 12;
                idx1 = idx2;
            }

            /* fill vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, points[i], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+1], uv, col_trans);
            }
        } else {
            nk_size idx1, i;
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed) {
                struct nk_vec2 d1 = nk_vec2_muls(normals[0], half_inner_thickness + AA_SIZE);
                struct nk_vec2 d2 = nk_vec2_muls(normals[0], half_inner_thickness);

                temp[0] = nk_vec2_add(points[0], d1);
                temp[1] = nk_vec2_add(points[0], d2);
                temp[2] = nk_vec2_sub(points[0], d2);
                temp[3] = nk_vec2_sub(points[0], d1);

                d1 = nk_vec2_muls(normals[points_count-1], half_inner_thickness + AA_SIZE);
                d2 = nk_vec2_muls(normals[points_count-1], half_inner_thickness);

                temp[(points_count-1)*4+0] = nk_vec2_add(points[points_count-1], d1);
                temp[(points_count-1)*4+1] = nk_vec2_add(points[points_count-1], d2);
                temp[(points_count-1)*4+2] = nk_vec2_sub(points[points_count-1], d2);
                temp[(points_count-1)*4+3] = nk_vec2_sub(points[points_count-1], d1);
            }

            /* add all elements */
            idx1 = index;
            for (i1 = 0; i1 < count; ++i1) {
                struct nk_vec2 dm_out, dm_in;
                const nk_size i2 = ((i1+1) == points_count) ? 0: (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 4);

                /* average normals */
                struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                float dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm_out = nk_vec2_muls(dm, ((half_inner_thickness) + AA_SIZE));
                dm_in = nk_vec2_muls(dm, half_inner_thickness);
                temp[i2*4+0] = nk_vec2_add(points[i2], dm_out);
                temp[i2*4+1] = nk_vec2_add(points[i2], dm_in);
                temp[i2*4+2] = nk_vec2_sub(points[i2], dm_in);
                temp[i2*4+3] = nk_vec2_sub(points[i2], dm_out);

                /* add indexes */
                ids[0] = (nk_draw_index)(idx2 + 1); ids[1] = (nk_draw_index)(idx1+1);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+1);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11] = (nk_draw_index)(idx2+1);
                ids[12]= (nk_draw_index)(idx2 + 2); ids[13] = (nk_draw_index)(idx1+2);
                ids[14]= (nk_draw_index)(idx1 + 3); ids[15] = (nk_draw_index)(idx1+3);
                ids[16]= (nk_draw_index)(idx2 + 3); ids[17] = (nk_draw_index)(idx2+2);
                ids += 18;
                idx1 = idx2;
            }

            /* add vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+1], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+2], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+3], uv, col_trans);
            }
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        /* NON ANTI-ALIASED STROKE */
        nk_size i1 = 0;
        nk_size idx = list->vertex_count;
        const nk_size idx_count = count * 6;
        const nk_size vtx_count = count * 4;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);
        if (!vtx || !ids) return;

        for (i1 = 0; i1 < count; ++i1) {
            float dx, dy;
            const struct nk_vec2 uv = list->config.null.uv;
            const nk_size i2 = ((i1+1) == points_count) ? 0 : i1 + 1;
            const struct nk_vec2 p1 = points[i1];
            const struct nk_vec2 p2 = points[i2];
            struct nk_vec2 diff = nk_vec2_sub(p2, p1);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            /* add vertices */
            dx = diff.x * (thickness * 0.5f);
            dy = diff.y * (thickness * 0.5f);

            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x + dy, p1.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x + dy, p2.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x - dy, p2.y + dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x - dy, p1.y + dx), uv, col);

            ids[0] = (nk_draw_index)(idx+0); ids[1] = (nk_draw_index)(idx+1);
            ids[2] = (nk_draw_index)(idx+2); ids[3] = (nk_draw_index)(idx+0);
            ids[4] = (nk_draw_index)(idx+2); ids[5] = (nk_draw_index)(idx+3);

            ids += 6;
            idx += 4;
        }
    }
}